

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O2

int pushline(lua_State *L,int firstline)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 uStack_230;
  char buffer [512];
  
  pcVar3 = "_PROMPT";
  if (firstline == 0) {
    pcVar3 = "_PROMPT2";
  }
  uStack_230 = 0x103095;
  iVar1 = lua_getglobal(L,pcVar3);
  if (iVar1 == 0) {
    pcVar3 = "> ";
    if (firstline == 0) {
      pcVar3 = ">> ";
    }
  }
  else {
    uStack_230 = 0x1030aa;
    pcVar3 = (char *)luaL_tolstring(L,0xffffffff,0);
    uStack_230 = 0x1030bf;
    lua_rotate(L,0xfffffffe,0xffffffff);
    uStack_230 = 0x1030ca;
    lua_settop(L,0xfffffffe);
  }
  uStack_230 = 0x1030f2;
  fputs(pcVar3,_stdout);
  uStack_230 = 0x1030fa;
  fflush(_stdout);
  uStack_230 = 0x103111;
  pcVar3 = fgets(buffer,0x200,_stdin);
  if (pcVar3 == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    uStack_230 = 0x103121;
    lua_settop(L,0xfffffffffffffffe);
    uStack_230 = 0x103129;
    sVar2 = strlen(buffer);
    if (sVar2 == 0) {
      sVar2 = 0;
    }
    else if (buffer[sVar2 - 1] == '\n') {
      buffer[sVar2 - 1] = '\0';
      sVar2 = sVar2 - 1;
    }
    if ((firstline == 0) || (buffer[0] != '=')) {
      uStack_230 = 0x103175;
      lua_pushlstring(L,buffer,sVar2);
    }
    else {
      uStack_230 = 0x103165;
      lua_pushfstring(L,"return %s",buffer + 1);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int pushline (lua_State *L, int firstline) {
  char buffer[LUA_MAXINPUT];
  char *b = buffer;
  size_t l;
  const char *prmt = get_prompt(L, firstline);
  int readstatus = lua_readline(L, b, prmt);
  if (readstatus == 0)
    return 0;  /* no input (prompt will be popped by caller) */
  lua_pop(L, 1);  /* remove prompt */
  l = strlen(b);
  if (l > 0 && b[l-1] == '\n')  /* line ends with newline? */
    b[--l] = '\0';  /* remove it */
  if (firstline && b[0] == '=')  /* for compatibility with 5.2, ... */
    lua_pushfstring(L, "return %s", b + 1);  /* change '=' to 'return' */
  else
    lua_pushlstring(L, b, l);
  lua_freeline(L, b);
  return 1;
}